

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::FieldMask::_InternalParse(FieldMask *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  internal *this_00;
  char *size;
  bool bVar4;
  char cVar5;
  char cVar6;
  string **field_name;
  UnknownFieldSet *unknown;
  byte *pbVar7;
  uint res;
  string *s;
  pair<const_char_*,_unsigned_int> pVar8;
  StringPiece str;
  string *local_58;
  int *local_50;
  RepeatedPtrFieldBase *local_48;
  InternalMetadata *local_40;
  byte *local_38;
  char *ptr_local;
  
  local_40 = &(this->super_Message).super_MessageLite._internal_metadata_;
  local_48 = &(this->paths_).super_RepeatedPtrFieldBase;
  local_50 = &(this->paths_).super_RepeatedPtrFieldBase.current_size_;
  local_38 = (byte *)ptr;
  do {
    bVar4 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar4) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    pbVar7 = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*pbVar7 * 0x80) - 0x80;
      if ((char)*pbVar7 < '\0') {
        pVar8 = internal::ReadTagFallback((char *)local_38,res);
        pbVar7 = (byte *)pVar8.first;
        res = pVar8.second;
      }
      else {
        pbVar7 = local_38 + 2;
      }
    }
    local_38 = pbVar7;
    if (pbVar7 == (byte *)0x0) {
      cVar5 = '\x04';
    }
    else if (res == 10) {
      local_38 = pbVar7 + -1;
      do {
        local_38 = local_38 + 1;
        pRVar3 = (this->paths_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar3 == (Rep *)0x0) {
LAB_002bddd8:
          internal::RepeatedPtrFieldBase::Reserve
                    (local_48,(this->paths_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002bdde7:
          field_name = &local_58;
          _InternalParse();
          s = local_58;
        }
        else {
          iVar2 = (this->paths_).super_RepeatedPtrFieldBase.current_size_;
          field_name = (string **)(long)iVar2;
          if (pRVar3->allocated_size <= iVar2) {
            if (pRVar3->allocated_size == (this->paths_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_002bddd8;
            goto LAB_002bdde7;
          }
          (this->paths_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
          s = (string *)pRVar3->elements[(long)field_name];
        }
        local_38 = (byte *)internal::InlineGreedyStringParser(s,(char *)local_38,ctx);
        this_00 = (internal *)(s->_M_dataplus)._M_p;
        size = (char *)s->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        str.length_ = (stringpiece_ssize_type)"google.protobuf.FieldMask.paths";
        str.ptr_ = size;
        bVar4 = internal::VerifyUTF8(this_00,str,(char *)field_name);
        cVar6 = '\x04';
        if ((bVar4) && (local_38 != (byte *)0x0)) {
          cVar6 = '\x06';
          if (local_38 < (ctx->super_EpsCopyInputStream).limit_end_) {
            cVar6 = '\0';
          }
        }
        cVar5 = '\x02';
        if (cVar6 != '\0') {
          if (cVar6 != '\x06') {
            cVar5 = cVar6;
          }
          break;
        }
      } while (*local_38 == 10);
    }
    else if (res == 0 || (res & 7) == 4) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
      cVar5 = '\t';
    }
    else {
      if (((ulong)local_40->ptr_ & 1) == 0) {
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_40);
      }
      else {
        unknown = (UnknownFieldSet *)(((ulong)local_40->ptr_ & 0xfffffffffffffffe) + 8);
      }
      local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
      cVar5 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
    if (cVar5 != '\x02') {
      if (cVar5 == '\x04') {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* FieldMask::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated string paths = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_paths();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.FieldMask.paths"));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}